

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calc.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  istream local_410 [8];
  fstream fileStream;
  undefined1 local_200 [8];
  CalcParser parser;
  
  Calc::CalcParser::CalcParser((CalcParser *)local_200);
  if (argc < 2) {
    Calc::CalcParser::Evaluate((CalcParser *)local_200,(istream *)&std::cin);
  }
  else {
    std::fstream::fstream(local_410,argv[1],_S_out|_S_in);
    Calc::CalcParser::Evaluate((CalcParser *)local_200,local_410);
    std::fstream::~fstream(local_410);
  }
  parser.variables._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&std::cout;
  std::
  copy<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,std::ostream_iterator<float,char,std::char_traits<char>>>
            ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
             local_410,
             (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
             parser.table.ReduceProductions.
             super__Vector_base<SGParser::ParseTable::ReduceProduction,_std::allocator<SGParser::ParseTable::ReduceProduction>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (ostream_iterator<float,_char,_std::char_traits<char>_> *)
             parser.numbers.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  Calc::CalcParser::~CalcParser((CalcParser *)local_200);
  return 0;
}

Assistant:

int main(int argc, char const* argv[]) {
    using namespace std;
    using namespace Calc;
    try {
        CalcParser parser;
        if (argc > 1) {
            fstream fileStream{argv[1]};
            parser.Evaluate(fileStream);
        } else {
            parser.Evaluate(cin);
        }
        auto const& numbers = parser.GetEvaluatedNumbers();
        copy(numbers.begin(), numbers.end(), ostream_iterator<CalcParser::Number>(cout, " "));
        cout << endl;
        return 0;
    } catch (exception const& failure) {
        cerr << failure.what() << endl;
        return 1;
    }
}